

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O0

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::CloneProperties
          (SerializationCloner<Js::StreamWriter> *this,SrcTypeId srcTypeId,Src src,Dst dst)

{
  bool bVar1;
  uint32 data;
  int iVar2;
  ScriptContext *requestContext;
  JavascriptArray *arr_00;
  SCATypeId typeId;
  undefined1 local_b8 [8];
  ObjectPropertyEnumerator propEnumerator;
  bool isSparseArray;
  JavascriptArray *arr;
  ScriptContext *scriptContext;
  JavascriptStaticEnumerator enumerator;
  RecyclableObject *obj;
  Dst dst_local;
  Src src_local;
  SrcTypeId srcTypeId_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  enumerator.arrayEnumerator.ptr = (JavascriptEnumerator *)VarTo<Js::RecyclableObject>(src);
  JavascriptStaticEnumerator::JavascriptStaticEnumerator
            ((JavascriptStaticEnumerator *)&scriptContext);
  requestContext = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this);
  bVar1 = DynamicObject::IsAnyArrayTypeId(srcTypeId);
  if (bVar1) {
    arr_00 = Js::JavascriptArray::FromAnyArray(src);
    propEnumerator.m_value._7_1_ = IsSparseArray(arr_00);
    typeId = SCA_DenseArray;
    if ((bool)propEnumerator.m_value._7_1_) {
      typeId = SCA_SparseArray;
    }
    WriteTypeId(this,typeId);
    data = ArrayObject::GetLength(&arr_00->super_ArrayObject);
    Write(this,data);
    if ((propEnumerator.m_value._7_1_ & 1) == 0) {
      WriteDenseArrayIndexProperties(this,arr_00);
    }
    else {
      WriteSparseArrayIndexProperties(this,arr_00);
    }
    Js::JavascriptArray::GetNonIndexEnumerator
              (arr_00,(JavascriptStaticEnumerator *)&scriptContext,requestContext);
  }
  else {
    iVar2 = (*((enumerator.arrayEnumerator.ptr)->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2b])
                      (enumerator.arrayEnumerator.ptr,&scriptContext,4,requestContext,0);
    if (iVar2 == 0) {
      propEnumerator.m_value._0_4_ = 0xffffffff;
      StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)&propEnumerator.m_value);
      return;
    }
  }
  ObjectPropertyEnumerator::ObjectPropertyEnumerator
            ((ObjectPropertyEnumerator *)local_b8,requestContext,
             &(enumerator.arrayEnumerator.ptr)->super_RecyclableObject,
             (JavascriptStaticEnumerator *)&scriptContext);
  WriteObjectProperties<Js::ObjectPropertyEnumerator>(this,(ObjectPropertyEnumerator *)local_b8);
  return;
}

Assistant:

void SerializationCloner<Writer>::CloneProperties(SrcTypeId srcTypeId, Src src, Dst dst)
    {
        RecyclableObject* obj = VarTo<RecyclableObject>(src);
        // allocate the JavascriptStaticEnumerator on the heap to avoid blowing the stack
        JavascriptStaticEnumerator enumerator;
        ScriptContext* scriptContext = this->GetScriptContext();
        if (DynamicObject::IsAnyArrayTypeId(srcTypeId))
        {
            JavascriptArray* arr = JavascriptArray::FromAnyArray(src);
            bool isSparseArray = IsSparseArray(arr);

            WriteTypeId(isSparseArray ? SCA_SparseArray : SCA_DenseArray);
            Write(arr->GetLength());

            if (isSparseArray)
            {
                WriteSparseArrayIndexProperties(arr);
            }
            else
            {
                WriteDenseArrayIndexProperties(arr);
            }

            // Now we only need to write remaining non-index properties
            arr->GetNonIndexEnumerator(&enumerator, scriptContext);
        }
        else if (!obj->GetEnumerator(&enumerator, EnumeratorFlags::SnapShotSemantics, scriptContext))
        {
            // Mark property end if we don't have enumerator
            m_writer->Write(static_cast<uint32>(SCA_PROPERTY_TERMINATOR));
            return;
        }

        ObjectPropertyEnumerator propEnumerator(scriptContext, obj, &enumerator);
        WriteObjectProperties(&propEnumerator);
    }